

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O3

uint32_t * FastPForLib::__fastpackwithoutmask1_24(uint32_t *in,uint32_t *out)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [32];
  undefined1 auVar5 [64];
  
  auVar5 = vmovdqu64_avx512f(*(undefined1 (*) [64])(in + 1));
  auVar5 = vpsllvd_avx512f(auVar5,_DAT_001a60c0);
  auVar3 = vpsllvd_avx2(*(undefined1 (*) [16])(in + 0x11),_DAT_001a4b40);
  auVar4 = vextracti64x4_avx512f(auVar5,1);
  auVar5 = vpord_avx512f(auVar5,ZEXT3264(auVar4));
  auVar1 = vpor_avx(auVar5._0_16_,auVar5._16_16_);
  auVar2 = vpshufd_avx(auVar1,0xee);
  auVar1 = vpor_avx(auVar1,auVar2);
  auVar2 = vpshufd_avx(auVar1,0x55);
  auVar1 = vpor_avx(auVar1,auVar2);
  auVar2 = vpshufd_avx(auVar3,0xee);
  auVar2 = vpor_avx(auVar3,auVar2);
  auVar3 = vpshufd_avx(auVar2,0x55);
  auVar2 = vpor_avx(auVar2,auVar3);
  *out = auVar2._0_4_ | in[0x15] << 0x15 | in[0x17] << 0x17 | in[0x16] << 0x16 | auVar1._0_4_ | *in;
  return out + 1;
}

Assistant:

uint32_t *__fastpackwithoutmask1_24(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 2;
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 5;
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 7;
  ++in;
  *out |= ((*in)) << 8;
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 11;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 13;
  ++in;
  *out |= ((*in)) << 14;
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 16;
  ++in;
  *out |= ((*in)) << 17;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 19;
  ++in;
  *out |= ((*in)) << 20;
  ++in;
  *out |= ((*in)) << 21;
  ++in;
  *out |= ((*in)) << 22;
  ++in;
  *out |= ((*in)) << 23;
  ++in;

  return out + 1;
}